

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::FileInputStream::CopyingFileInputStream::Close(CopyingFileInputStream *this)

{
  int iVar1;
  int *piVar2;
  LogMessageFatal local_20 [16];
  
  if (this->is_closed_ != true) {
    this->is_closed_ = true;
    iVar1 = anon_unknown_4::close_no_eintr(this->file_);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      this->errno_ = *piVar2;
    }
    return iVar1 == 0;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl.cc"
             ,0x65,0xb,"!is_closed_");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_20);
}

Assistant:

bool FileInputStream::CopyingFileInputStream::Close() {
  ABSL_CHECK(!is_closed_);

  is_closed_ = true;
  if (close_no_eintr(file_) != 0) {
    // The docs on close() do not specify whether a file descriptor is still
    // open after close() fails with EIO.  However, the glibc source code
    // seems to indicate that it is not.
    errno_ = errno;
    return false;
  }

  return true;
}